

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

bool32 __thiscall rw::Geometry::hasColoredMaterial(Geometry *this)

{
  int local_1c;
  int32 i;
  Geometry *this_local;
  
  local_1c = 0;
  while( true ) {
    if ((this->matList).numMaterials <= local_1c) {
      return 0;
    }
    if ((((((this->matList).materials[local_1c]->color).red != 0xff) ||
         (((this->matList).materials[local_1c]->color).green != 0xff)) ||
        (((this->matList).materials[local_1c]->color).blue != 0xff)) ||
       (((this->matList).materials[local_1c]->color).alpha != 0xff)) break;
    local_1c = local_1c + 1;
  }
  return 1;
}

Assistant:

bool32
Geometry::hasColoredMaterial(void)
{
	for(int32 i = 0; i < this->matList.numMaterials; i++)
		if(this->matList.materials[i]->color.red != 255 ||
		   this->matList.materials[i]->color.green != 255 ||
		   this->matList.materials[i]->color.blue != 255 ||
		   this->matList.materials[i]->color.alpha != 255)
			return 1;
	return 0;
}